

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O1

int event_reinit(event_base *base)

{
  evsig_info *ev;
  event *ev_00;
  short *psVar1;
  eventop *peVar2;
  _func_int_event_base_ptr *p_Var3;
  int iVar4;
  int iVar5;
  void *pvVar6;
  
  if (base->th_base_lock != (void *)0x0) {
    (*evthread_lock_fns_.lock)(0,base->th_base_lock);
  }
  if (base->running_loop == 0) {
    peVar2 = base->evsel;
    if (peVar2->need_reinit != 0) {
      base->evsel = &nil_eventop;
    }
    ev = &base->sig;
    iVar4 = (base->sig).ev_signal_added;
    if (iVar4 != 0) {
      event_del_nolock_(&ev->ev_signal,2);
      event_debug_assert_not_added_(&ev->ev_signal);
      event_debug_note_teardown_(&ev->ev_signal);
      psVar1 = &(base->sig).ev_signal.ev_evcallback.evcb_flags;
      *(byte *)psVar1 = (byte)*psVar1 & 0x7f;
      (base->sig).ev_signal.ev_timeout.tv_sec = 0;
      (base->sig).ev_signal.ev_timeout.tv_usec = 0;
      (base->sig).ev_signal.ev_.ev_io.ev_timeout.tv_usec = 0;
      (base->sig).ev_signal.ev_events = 0;
      (base->sig).ev_signal.ev_res = 0;
      *(undefined4 *)&(base->sig).ev_signal.field_0x6c = 0;
      (base->sig).ev_signal.ev_.ev_io.ev_io_next.le_prev = (event **)0x0;
      (base->sig).ev_signal.ev_.ev_io.ev_timeout.tv_sec = 0;
      (base->sig).ev_signal.ev_base = (event_base *)0x0;
      (base->sig).ev_signal.ev_.ev_io.ev_io_next.le_next = (event *)0x0;
      (base->sig).ev_signal.ev_timeout_pos.ev_next_with_common_timeout.tqe_prev = (event **)0x0;
      *(undefined8 *)&(base->sig).ev_signal.ev_fd = 0;
      (base->sig).ev_signal.ev_evcallback.evcb_arg = (void *)0x0;
      (base->sig).ev_signal.ev_timeout_pos.ev_next_with_common_timeout.tqe_next = (event *)0x0;
      (base->sig).ev_signal.ev_evcallback.evcb_flags = 0;
      (base->sig).ev_signal.ev_evcallback.evcb_pri = '\0';
      (base->sig).ev_signal.ev_evcallback.evcb_closure = '\0';
      *(undefined4 *)&(base->sig).ev_signal.ev_evcallback.field_0x14 = 0;
      (base->sig).ev_signal.ev_evcallback.evcb_cb_union.evcb_callback =
           (_func_void_int_short_void_ptr *)0x0;
      (ev->ev_signal).ev_evcallback.evcb_active_next.tqe_next = (event_callback *)0x0;
      (base->sig).ev_signal.ev_evcallback.evcb_active_next.tqe_prev = (event_callback **)0x0;
      (base->sig).ev_signal_added = 0;
    }
    iVar5 = (base->sig).ev_signal_pair[0];
    if (iVar5 != -1) {
      evutil_closesocket(iVar5);
    }
    iVar5 = (base->sig).ev_signal_pair[1];
    if (iVar5 != -1) {
      evutil_closesocket(iVar5);
    }
    p_Var3 = base->th_notify_fn;
    if (p_Var3 != (_func_int_event_base_ptr *)0x0) {
      base->th_notify_fn = (_func_int_event_base_ptr *)0x0;
    }
    if (base->th_notify_fd[0] != -1) {
      ev_00 = &base->th_notify;
      event_del_nolock_(ev_00,2);
      evutil_closesocket(base->th_notify_fd[0]);
      if (base->th_notify_fd[1] != -1) {
        evutil_closesocket(base->th_notify_fd[1]);
      }
      base->th_notify_fd[0] = -1;
      base->th_notify_fd[1] = -1;
      event_debug_assert_not_added_(ev_00);
      event_debug_note_teardown_(ev_00);
      psVar1 = &(base->th_notify).ev_evcallback.evcb_flags;
      *(byte *)psVar1 = (byte)*psVar1 & 0x7f;
    }
    base->evsel = peVar2;
    if (peVar2->need_reinit == 0) {
      iVar5 = evsig_init_(base);
      if (iVar5 == 0 && iVar4 != 0) {
        iVar5 = event_add_nolock_(&ev->ev_signal,(timeval *)0x0,0);
        if (iVar5 == 0) {
          (base->sig).ev_signal_added = 1;
          iVar5 = 0;
        }
      }
    }
    else {
      if (peVar2->dealloc != (_func_void_event_base_ptr *)0x0) {
        (*peVar2->dealloc)(base);
      }
      pvVar6 = (*peVar2->init)(base);
      base->evbase = pvVar6;
      if (pvVar6 == (void *)0x0) {
        event_errx(1,"%s: could not reinitialize event mechanism","event_reinit");
      }
      event_changelist_freemem_(&base->changelist);
      iVar4 = evmap_reinit_(base);
      iVar5 = iVar4 >> 0x1f;
    }
    if (iVar5 == 0 && p_Var3 != (_func_int_event_base_ptr *)0x0) {
      iVar5 = evthread_make_base_notifiable_nolock_(base);
    }
  }
  else {
    event_warnx("%s: forked from the event_loop.","event_reinit");
    iVar5 = -1;
  }
  if (base->th_base_lock != (void *)0x0) {
    (*evthread_lock_fns_.unlock)(0,base->th_base_lock);
  }
  return iVar5;
}

Assistant:

int
event_reinit(struct event_base *base)
{
	const struct eventop *evsel;
	int res = 0;
	int was_notifiable = 0;
	int had_signal_added = 0;

	EVBASE_ACQUIRE_LOCK(base, th_base_lock);

	if (base->running_loop) {
		event_warnx("%s: forked from the event_loop.", __func__);
		res = -1;
		goto done;
	}

	evsel = base->evsel;

	/* check if this event mechanism requires reinit on the backend */
	if (evsel->need_reinit) {
		/* We're going to call event_del() on our notify events (the
		 * ones that tell about signals and wakeup events).  But we
		 * don't actually want to tell the backend to change its
		 * state, since it might still share some resource (a kqueue,
		 * an epoll fd) with the parent process, and we don't want to
		 * delete the fds from _that_ backend, we temporarily stub out
		 * the evsel with a replacement.
		 */
		base->evsel = &nil_eventop;
	}

	/* We need to re-create a new signal-notification fd and a new
	 * thread-notification fd.  Otherwise, we'll still share those with
	 * the parent process, which would make any notification sent to them
	 * get received by one or both of the event loops, more or less at
	 * random.
	 */
	if (base->sig.ev_signal_added) {
		event_del_nolock_(&base->sig.ev_signal, EVENT_DEL_AUTOBLOCK);
		event_debug_unassign(&base->sig.ev_signal);
		memset(&base->sig.ev_signal, 0, sizeof(base->sig.ev_signal));
		had_signal_added = 1;
		base->sig.ev_signal_added = 0;
	}
	if (base->sig.ev_signal_pair[0] != -1)
		EVUTIL_CLOSESOCKET(base->sig.ev_signal_pair[0]);
	if (base->sig.ev_signal_pair[1] != -1)
		EVUTIL_CLOSESOCKET(base->sig.ev_signal_pair[1]);
	if (base->th_notify_fn != NULL) {
		was_notifiable = 1;
		base->th_notify_fn = NULL;
	}
	if (base->th_notify_fd[0] != -1) {
		event_del_nolock_(&base->th_notify, EVENT_DEL_AUTOBLOCK);
		EVUTIL_CLOSESOCKET(base->th_notify_fd[0]);
		if (base->th_notify_fd[1] != -1)
			EVUTIL_CLOSESOCKET(base->th_notify_fd[1]);
		base->th_notify_fd[0] = -1;
		base->th_notify_fd[1] = -1;
		event_debug_unassign(&base->th_notify);
	}

	/* Replace the original evsel. */
        base->evsel = evsel;

	if (evsel->need_reinit) {
		/* Reconstruct the backend through brute-force, so that we do
		 * not share any structures with the parent process. For some
		 * backends, this is necessary: epoll and kqueue, for
		 * instance, have events associated with a kernel
		 * structure. If didn't reinitialize, we'd share that
		 * structure with the parent process, and any changes made by
		 * the parent would affect our backend's behavior (and vice
		 * versa).
		 */
		if (base->evsel->dealloc != NULL)
			base->evsel->dealloc(base);
		base->evbase = evsel->init(base);
		if (base->evbase == NULL) {
			event_errx(1,
			   "%s: could not reinitialize event mechanism",
			   __func__);
			res = -1;
			goto done;
		}

		/* Empty out the changelist (if any): we are starting from a
		 * blank slate. */
		event_changelist_freemem_(&base->changelist);

		/* Tell the event maps to re-inform the backend about all
		 * pending events. This will make the signal notification
		 * event get re-created if necessary. */
		if (evmap_reinit_(base) < 0)
			res = -1;
	} else {
		res = evsig_init_(base);
		if (res == 0 && had_signal_added) {
			res = event_add_nolock_(&base->sig.ev_signal, NULL, 0);
			if (res == 0)
				base->sig.ev_signal_added = 1;
		}
	}

	/* If we were notifiable before, and nothing just exploded, become
	 * notifiable again. */
	if (was_notifiable && res == 0)
		res = evthread_make_base_notifiable_nolock_(base);

done:
	EVBASE_RELEASE_LOCK(base, th_base_lock);
	return (res);
}